

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DTDScanner.cpp
# Opt level: O3

bool __thiscall
xercesc_4_0::DTDScanner::scanAttValue
          (DTDScanner *this,XMLCh *attrName,XMLBuffer *toFill,AttTypes type)

{
  XMLByte XVar1;
  ulong uVar2;
  ulong uVar3;
  XMLByte *pXVar4;
  bool bVar5;
  XMLCh XVar6;
  XMLBuffer *pXVar7;
  XMLBuffer *pXVar8;
  bool bVar9;
  uint uVar10;
  EntityExpRes EVar11;
  XMLSize_t XVar12;
  XMLCh *pXVar13;
  UnexpectedEOFException *this_00;
  XMLSize_t XVar15;
  XMLCh XVar16;
  ulong uVar17;
  byte bVar18;
  bool escaped;
  XMLCh nextCh;
  XMLCh secondCh;
  XMLCh quoteCh;
  XMLCh tmpBuf [9];
  bool local_79;
  int local_78;
  XMLCh local_72;
  int local_70;
  XMLCh local_6c;
  XMLCh local_6a;
  ulong local_68;
  AttTypes local_5c;
  XMLBuffer *local_58;
  XMLCh *local_50;
  XMLCh local_48 [12];
  undefined7 uVar14;
  
  toFill->fIndex = 0;
  local_5c = type;
  bVar9 = ReaderMgr::skipIfQuote(this->fReaderMgr,&local_6a);
  if (!bVar9) {
    return false;
  }
  uVar2 = this->fReaderMgr->fCurReader->fReaderNum;
  local_6c = L'\0';
  local_78 = 1;
  local_68 = 0;
  local_70 = local_78;
  local_58 = toFill;
  local_50 = attrName;
  bVar9 = false;
LAB_003015ba:
  bVar5 = bVar9;
  local_72 = ReaderMgr::getNextChar(this->fReaderMgr);
  uVar10 = (uint)(ushort)local_72;
  uVar17 = (ulong)uVar10;
  if (local_72 == L'\0') {
    this_00 = (UnexpectedEOFException *)__cxa_allocate_exception(0x30);
    UnexpectedEOFException::UnexpectedEOFException
              (this_00,
               "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/validators/DTD/DTDScanner.cpp"
               ,0x313,Gen_UnexpectedEOF,this->fMemoryManager);
    __cxa_throw(this_00,&UnexpectedEOFException::typeinfo,XMLException::~XMLException);
  }
  if (local_72 == local_6a) {
    uVar3 = this->fReaderMgr->fCurReader->fReaderNum;
    bVar9 = uVar2 == uVar3;
    if (bVar9) {
      return bVar9;
    }
    if (uVar3 <= uVar2 && !bVar9) {
      XMLScanner::emitError(this->fScanner,PartialMarkupInEntity);
      return bVar9;
    }
  }
  local_79 = false;
  if (local_72 == L'&') goto code_r0x00301609;
  if ((uVar10 & 0xfc00) != 0xd800) {
    if (bVar5) {
      if (0xfbff < (uVar10 + 0x2000 & 0xffff)) {
        bVar9 = false;
        goto LAB_00301727;
      }
      bVar18 = 0;
      XMLScanner::emitError(this->fScanner,Expected2ndSurrogateChar);
      bVar5 = false;
    }
    else {
      if ((this->fReaderMgr->fCurReader->fgCharCharsTable[(ushort)local_72] & 0x40) == 0) {
        XMLString::binToText((uint)(ushort)local_72,local_48,8,0x10,this->fMemoryManager);
        XMLScanner::emitError
                  (this->fScanner,InvalidCharacterInAttrValue,local_50,local_48,(XMLCh *)0x0,
                   (XMLCh *)0x0);
      }
      bVar18 = 0;
      bVar5 = false;
    }
    goto LAB_003016f2;
  }
  bVar9 = true;
  if (bVar5) {
    XMLScanner::emitError(this->fScanner,Expected2ndSurrogateChar);
    bVar9 = bVar5;
  }
LAB_00301727:
  if (local_5c == AttTypes_Min) goto LAB_00301799;
  goto LAB_00301731;
code_r0x00301609:
  EVar11 = scanEntityRef(this,&local_72,&local_6c,&local_79);
  bVar9 = false;
  if (EVar11 == EntityExp_Returned) {
    uVar17 = (ulong)(ushort)local_72;
    bVar18 = local_79;
LAB_003016f2:
    uVar10 = (uint)uVar17;
    XVar16 = (XMLCh)uVar17;
    if (XVar16 == L'<' && (bVar18 & 1) == 0) {
      XMLScanner::emitError
                (this->fScanner,BracketInAttrValue,local_50,(XMLCh *)0x0,(XMLCh *)0x0,(XMLCh *)0x0);
    }
    bVar9 = bVar5;
    if (local_5c == AttTypes_Min) {
      if ((bVar18 & 1) == 0) {
LAB_00301799:
        XVar16 = (XMLCh)uVar10;
        if (((ushort)XVar16 < 0xe) && ((0x2600U >> (uVar10 & 0x1f) & 1) != 0)) {
          local_72 = L' ';
          XVar16 = L' ';
        }
      }
    }
    else {
LAB_00301731:
      pXVar7 = local_58;
      pXVar4 = this->fReaderMgr->fCurReader->fgCharCharsTable;
      XVar16 = (XMLCh)uVar17;
      XVar1 = pXVar4[uVar17];
      uVar14 = (undefined7)((ulong)pXVar4 >> 8);
      XVar12 = CONCAT71(uVar14,XVar1);
      if (local_70 == 0) {
        local_70 = 0;
        if ((char)XVar1 < '\0') goto LAB_003015ba;
        if ((local_68 & 1) == 0) {
          local_78 = 1;
        }
        else {
          local_78 = 1;
          XVar12 = local_58->fIndex;
          if (XVar12 == local_58->fCapacity) {
            local_68 = CONCAT71((int7)(XVar12 >> 8),1);
            local_70 = 0;
            XMLBuffer::ensureCapacity(local_58,1);
            XVar12 = pXVar7->fIndex;
          }
          pXVar7->fIndex = XVar12 + 1;
          pXVar7->fBuffer[XVar12] = L' ';
        }
        local_68 = CONCAT71((int7)(XVar12 >> 8),1);
      }
      else {
        local_70 = 0;
        if ((char)XVar1 < '\0') goto LAB_003015ba;
        local_68 = CONCAT71(uVar14,1);
        local_78 = 1;
      }
    }
    pXVar7 = local_58;
    XVar12 = local_58->fIndex;
    if (XVar12 == local_58->fCapacity) {
      local_70 = local_78;
      XMLBuffer::ensureCapacity(local_58,1);
      XVar12 = pXVar7->fIndex;
    }
    pXVar8 = local_58;
    XVar6 = local_6c;
    pXVar13 = pXVar7->fBuffer;
    XVar15 = XVar12 + 1;
    pXVar7->fIndex = XVar15;
    pXVar13[XVar12] = XVar16;
    local_70 = local_78;
    if (local_6c != L'\0') {
      if (XVar15 == local_58->fCapacity) {
        XMLBuffer::ensureCapacity(local_58,1);
        XVar15 = pXVar8->fIndex;
        pXVar13 = pXVar8->fBuffer;
      }
      pXVar8->fIndex = XVar15 + 1;
      pXVar13[XVar15] = XVar6;
      local_6c = L'\0';
      local_70 = local_78;
    }
  }
  goto LAB_003015ba;
}

Assistant:

bool DTDScanner::scanAttValue(const   XMLCh* const        attrName
                                ,       XMLBuffer&          toFill
                                , const XMLAttDef::AttTypes type)
{
    enum States
    {
        InWhitespace
        , InContent
    };

    // Reset the target buffer
    toFill.reset();

    // Get the next char which must be a single or double quote
    XMLCh quoteCh;
    if (!fReaderMgr->skipIfQuote(quoteCh))
        return false;

    //
    //  We have to get the current reader because we have to ignore closing
    //  quotes until we hit the same reader again.
    //
    const XMLSize_t curReader = fReaderMgr->getCurrentReaderNum();

    //
    //  Loop until we get the attribute value. Note that we use a double
    //  loop here to avoid the setup/teardown overhead of the exception
    //  handler on every round.
    //
    XMLCh   nextCh;
    XMLCh   secondCh = 0;
    States  curState = InContent;
    bool    firstNonWS = false;
    bool    gotLeadingSurrogate = false;
    bool    escaped;
    while (true)
    {
    try
    {
        while(true)
        {
            nextCh = fReaderMgr->getNextChar();

            if (!nextCh)
                ThrowXMLwithMemMgr(UnexpectedEOFException, XMLExcepts::Gen_UnexpectedEOF, fMemoryManager);

            // Check for our ending quote in the same entity
            if (nextCh == quoteCh)
            {
                if (curReader == fReaderMgr->getCurrentReaderNum())
                    return true;

                // Watch for spillover into a previous entity
                if (curReader > fReaderMgr->getCurrentReaderNum())
                {
                    fScanner->emitError(XMLErrs::PartialMarkupInEntity);
                    return false;
                }
            }

            //
            //  Check for an entity ref now, before we let it affect our
            //  whitespace normalization logic below. We ignore the empty flag
            //  in this one.
            //
            escaped = false;
            if (nextCh == chAmpersand)
            {
                if (scanEntityRef(nextCh, secondCh, escaped) != EntityExp_Returned)
                {
                    gotLeadingSurrogate = false;
                    continue;
                }
            }
            else if ((nextCh >= 0xD800) && (nextCh <= 0xDBFF))
            {
                // Check for correct surrogate pairs
                if (gotLeadingSurrogate)
                    fScanner->emitError(XMLErrs::Expected2ndSurrogateChar);
                else
                    gotLeadingSurrogate = true;
            }
             else
            {
                if (gotLeadingSurrogate)
                {
                    if ((nextCh < 0xDC00) || (nextCh > 0xDFFF))
                        fScanner->emitError(XMLErrs::Expected2ndSurrogateChar);
                }
                // Its got to at least be a valid XML character
                else if (!fReaderMgr->getCurrentReader()->isXMLChar(nextCh))
                {
                    XMLCh tmpBuf[9];
                    XMLString::binToText
                    (
                        nextCh
                        , tmpBuf
                        , 8
                        , 16
                        , fMemoryManager
                    );
                    fScanner->emitError
                    (
                        XMLErrs::InvalidCharacterInAttrValue
                        , attrName
                        , tmpBuf
                    );
                }

                gotLeadingSurrogate = false;
            }

            //
            //  If its not escaped, then make sure its not a < character, which
            //  is not allowed in attribute values.
            //
            if (!escaped && (nextCh == chOpenAngle))
                fScanner->emitError(XMLErrs::BracketInAttrValue, attrName);

            //
            //  If the attribute is a CDATA type we do simple replacement of
            //  tabs and new lines with spaces, if the character is not escaped
            //  by way of a char ref.
            //
            //  Otherwise, we do the standard non-CDATA normalization of
            //  compressing whitespace to single spaces and getting rid of
            //  leading and trailing whitespace.
            //
            if (type == XMLAttDef::CData)
            {
                if (!escaped)
                {
                    if ((nextCh == 0x09) || (nextCh == 0x0A) || (nextCh == 0x0D))
                        nextCh = chSpace;
                }
            }
             else
            {
                if (curState == InWhitespace)
                {
                    if (!fReaderMgr->getCurrentReader()->isWhitespace(nextCh))
                    {
                        if (firstNonWS)
                            toFill.append(chSpace);
                        curState = InContent;
                        firstNonWS = true;
                    }
                     else
                    {
                        continue;
                    }
                }
                 else if (curState == InContent)
                {
                    if (fReaderMgr->getCurrentReader()->isWhitespace(nextCh))
                    {
                        curState = InWhitespace;
                        continue;
                    }
                    firstNonWS = true;
                }
            }

            // Else add it to the buffer
            toFill.append(nextCh);

            if (secondCh)
            {
                toFill.append(secondCh);
                secondCh=0;
            }
        }
    }

    catch(const EndOfEntityException&)
    {
        // Just eat it and continue.
        gotLeadingSurrogate = false;
        escaped = false;
    }
    }
    return true;
}